

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceTests.cpp
# Opt level: O0

int testStateFeatureDescriptionInInputs(void)

{
  bool bVar1;
  ModelDescription *this;
  FeatureDescription *feature;
  ostream *poVar2;
  Result local_a8;
  ValidationPolicy local_7d;
  allocator<char> local_79;
  undefined1 local_78 [3];
  ValidationPolicy validationPolicy;
  ModelDescription *description;
  Model m;
  
  CoreML::Specification::Model::Model((Model *)&description);
  this = CoreML::Specification::Model::mutable_description((Model *)&description);
  feature = CoreML::Specification::ModelDescription::add_input(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_78,"x",&local_79);
  setupStateFeature(feature,(string *)local_78);
  std::__cxx11::string::~string((string *)local_78);
  std::allocator<char>::~allocator(&local_79);
  local_7d = validationPolicyForStateTests();
  CoreML::validateModelDescription(&local_a8,this,9,&local_7d);
  bVar1 = CoreML::Result::good(&local_a8);
  CoreML::Result::~Result(&local_a8);
  m._oneof_case_[0]._0_1_ = ((bVar1 ^ 0xffU) & 1) != 0;
  if (m._oneof_case_[0]._0_1_) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1a6);
    poVar2 = std::operator<<(poVar2,": error: ");
    poVar2 = std::operator<<(poVar2,
                             "(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_NEWEST, validationPolicy)).good()"
                            );
    poVar2 = std::operator<<(poVar2," was false, expected true.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  m._oneof_case_[0]._1_3_ = 0;
  CoreML::Specification::Model::~Model((Model *)&description);
  return m._oneof_case_[0];
}

Assistant:

int testStateFeatureDescriptionInInputs() {
    Specification::Model m;
    auto *description = m.mutable_description();

    setupStateFeature(description->add_input(), "x");

    // Check model specification version requirements.
    auto validationPolicy = validationPolicyForStateTests();
    ML_ASSERT_GOOD(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_NEWEST, validationPolicy));

    return 0;
}